

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_24::SourceLocationCommentPrinter::SourceLocationCommentPrinter
          (SourceLocationCommentPrinter *this,FileDescriptor *file,
          vector<int,_std::allocator<int>_> *path,string *prefix,DebugStringOptions *options)

{
  bool bVar1;
  
  (this->source_loc_).leading_comments._M_dataplus._M_p =
       (pointer)&(this->source_loc_).leading_comments.field_2;
  (this->source_loc_).leading_comments._M_string_length = 0;
  (this->source_loc_).leading_comments.field_2._M_local_buf[0] = '\0';
  (this->source_loc_).trailing_comments._M_dataplus._M_p =
       (pointer)&(this->source_loc_).trailing_comments.field_2;
  (this->source_loc_).trailing_comments._M_string_length = 0;
  (this->source_loc_).trailing_comments.field_2._M_local_buf[0] = '\0';
  (this->source_loc_).leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->source_loc_).leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->source_loc_).leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = options->elide_group_body;
  (this->options_).include_comments = options->include_comments;
  (this->options_).elide_group_body = bVar1;
  (this->options_).elide_oneof_body = options->elide_oneof_body;
  std::__cxx11::string::string((string *)&this->prefix_,(string *)prefix);
  if (options->include_comments == true) {
    bVar1 = FileDescriptor::GetSourceLocation(file,path,&this->source_loc_);
  }
  else {
    bVar1 = false;
  }
  this->have_source_loc_ = bVar1;
  return;
}

Assistant:

SourceLocationCommentPrinter(const FileDescriptor* file,
                               const std::vector<int>& path,
                               const std::string& prefix,
                               const DebugStringOptions& options)
      : options_(options), prefix_(prefix) {
    // Perform the SourceLocation lookup only if we're including user comments,
    // because the lookup is fairly expensive.
    have_source_loc_ =
        options.include_comments && file->GetSourceLocation(path, &source_loc_);
  }